

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

nk_vec2 nk_layout_space_to_local(nk_context *ctx,nk_vec2 ret)

{
  undefined4 uVar1;
  undefined4 uVar2;
  nk_panel *pnVar3;
  nk_vec2 nVar4;
  
  pnVar3 = ctx->current->layout;
  uVar1 = pnVar3->at_x;
  uVar2 = pnVar3->at_y;
  nVar4.y = ret.y + ((float)((uint)*pnVar3->offset >> 0x10) - (float)uVar2);
  nVar4.x = ret.x + ((float)((uint)*pnVar3->offset & 0xffff) - (float)uVar1);
  return nVar4;
}

Assistant:

NK_API struct nk_vec2
nk_layout_space_to_local(struct nk_context *ctx, struct nk_vec2 ret)
{
    struct nk_window *win;
    struct nk_panel *layout;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    win = ctx->current;
    layout = win->layout;

    ret.x += -layout->at_x + layout->offset->x;
    ret.y += -layout->at_y + layout->offset->y;
    return ret;
}